

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O3

void __thiscall DHUDMessage::ResetText(DHUDMessage *this,char *text)

{
  FBrokenLines *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (this->HUDWidth == 0) {
    iVar4 = active_con_scaletext();
    iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar2 = CleanXfac;
    if (iVar4 != 0) {
      iVar2 = active_con_scaletext();
    }
    iVar3 = iVar3 / iVar2;
  }
  else {
    iVar3 = this->HUDWidth;
    if (this->WrapWidth != 0) {
      iVar3 = this->WrapWidth;
    }
  }
  if (this->Lines != (FBrokenLines *)0x0) {
    V_FreeBrokenLines(this->Lines);
  }
  if (this->NoWrap != false) {
    iVar3 = 0x7fffffff;
  }
  pFVar1 = V_BreakLines(this->Font,iVar3,(BYTE *)text,false);
  this->Lines = pFVar1;
  this->NumLines = 0;
  this->Width = 0;
  this->Height = 0;
  if ((pFVar1 != (FBrokenLines *)0x0) && (iVar3 = pFVar1->Width, -1 < iVar3)) {
    iVar2 = 0;
    iVar4 = 0;
    iVar5 = 0;
    do {
      pFVar1 = pFVar1 + 1;
      iVar4 = iVar4 + this->Font->FontHeight;
      if (iVar3 < iVar5) {
        iVar3 = iVar5;
      }
      iVar5 = iVar3;
      iVar3 = pFVar1->Width;
      iVar2 = iVar2 + 1;
    } while (-1 < iVar3);
    this->Height = iVar4;
    this->Width = iVar5;
    this->NumLines = iVar2;
  }
  return;
}

Assistant:

void DHUDMessage::ResetText (const char *text)
{
	int width;

	if (HUDWidth != 0)
	{
		width = WrapWidth == 0 ? HUDWidth : WrapWidth;
	}
	else
	{
		switch (active_con_scaletext())
		{
		case 0: width = SCREENWIDTH / CleanXfac; break;
		default: width = SCREENWIDTH / active_con_scaletext(); break;
		}
	}

	if (Lines != NULL)
	{
		V_FreeBrokenLines (Lines);
	}

	Lines = V_BreakLines (Font, NoWrap ? INT_MAX : width, (BYTE *)text);

	NumLines = 0;
	Width = 0;
	Height = 0;

	if (Lines)
	{
		for (; Lines[NumLines].Width >= 0; NumLines++)
		{
			Height += Font->GetHeight ();
			Width = MAX<int> (Width, Lines[NumLines].Width);
		}
	}
}